

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall Thread::start(Thread *this,Priority priority,size_t stackSize)

{
  int iVar1;
  pthread_attr_t *__attr;
  char local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  pthread_attr_t *pattr;
  Log local_88;
  Log local_78;
  Log local_68;
  pthread_attr_t attr;
  
  pattr = (pthread_attr_t *)0x0;
  if (priority == Idle) {
    initAttr(&pattr,&attr);
    __attr = pattr;
    iVar1 = pthread_attr_setschedpolicy((pthread_attr_t *)pattr,5);
    if (iVar1 != 0) {
      error();
      Log::operator<<(&local_68,local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    }
  }
  else {
    __attr = (pthread_attr_t *)0x0;
  }
  if (stackSize != 0) {
    initAttr(&pattr,&attr);
    __attr = pattr;
    iVar1 = pthread_attr_setstacksize((pthread_attr_t *)pattr,stackSize);
    if (iVar1 != 0) {
      error();
      Log::operator<<(&local_78,local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    }
  }
  this->mRunning = true;
  iVar1 = pthread_create(&this->mThread,(pthread_attr_t *)__attr,localStart,this);
  if (iVar1 != 0) {
    error();
    Log::operator<<(&local_88,local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  }
  if (__attr != (pthread_attr_t *)0x0) {
    pthread_attr_destroy((pthread_attr_t *)__attr);
  }
  return;
}

Assistant:

void Thread::start(Priority priority, size_t stackSize)
{
    pthread_attr_t attr;
    pthread_attr_t* pattr = 0;
    if (priority == Idle) {
#ifdef HAVE_SCHEDIDLE
        initAttr(&pattr, &attr);
        if (pthread_attr_setschedpolicy(pattr, SCHED_IDLE) != 0) {
            error() << "pthread_attr_setschedpolicy failed";
        }
#endif
    }
    if (stackSize > 0) {
        initAttr(&pattr, &attr);
        if (pthread_attr_setstacksize(pattr, stackSize) != 0) {
            error() << "pthread_attr_setstacksize failed";
        }
    }
    mRunning = true;
    if (pthread_create(&mThread, pattr, localStart, this) != 0) {
        error() << "pthread_create failed";
    }
    if (pattr) {
        pthread_attr_destroy(pattr);
    }
}